

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O3

bool QDir::match(QStringList *filters,QString *fileName)

{
  bool bVar1;
  QString *pQVar2;
  long in_FS_OFFSET;
  QStringView pattern;
  QRegularExpression rx;
  QRegularExpressionMatch QStack_48;
  Data *local_40;
  char16_t *local_38;
  
  local_38 = *(char16_t **)(in_FS_OFFSET + 0x28);
  if ((filters->d).size == 0) {
    bVar1 = false;
  }
  else {
    pQVar2 = (filters->d).ptr;
    do {
      local_40 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      pattern.m_data = (storage_type_conflict *)(pQVar2->d).size;
      pattern.m_size = (qsizetype)&local_40;
      QRegularExpression::fromWildcard
                (pattern,(CaseSensitivity)(pQVar2->d).ptr,(WildcardConversionOptions)0x0);
      QRegularExpression::match
                ((QRegularExpression *)&QStack_48,(QString *)&local_40,(qsizetype)fileName,
                 NormalMatch,(MatchOptions)0x0);
      bVar1 = QRegularExpressionMatch::hasMatch(&QStack_48);
      QRegularExpressionMatch::~QRegularExpressionMatch(&QStack_48);
      QRegularExpression::~QRegularExpression((QRegularExpression *)&local_40);
      if (bVar1) break;
      pQVar2 = pQVar2 + 1;
    } while (pQVar2 != (filters->d).ptr + (filters->d).size);
  }
  if (*(char16_t **)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool QDir::match(const QStringList &filters, const QString &fileName)
{
    for (QStringList::ConstIterator sit = filters.constBegin(); sit != filters.constEnd(); ++sit) {
        // Insensitive exact match
        auto rx = QRegularExpression::fromWildcard(*sit, Qt::CaseInsensitive);
        if (rx.match(fileName).hasMatch())
            return true;
    }
    return false;
}